

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginComboPreview(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiComboPreviewData *r;
  ImVec2 IVar5;
  ImGuiComboPreviewData *preview_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  r = &GImGui->ComboPreviewData;
  if (((pIVar2->SkipItems & 1U) != 0) ||
     (bVar4 = ImRect::Overlaps(&pIVar2->ClipRect,&(GImGui->LastItemData).Rect), !bVar4)) {
    return false;
  }
  fVar1 = (pIVar3->LastItemData).Rect.Min.x;
  bVar4 = false;
  if ((fVar1 == (r->PreviewRect).Min.x) && (!NAN(fVar1) && !NAN((r->PreviewRect).Min.x))) {
    bVar4 = (pIVar3->LastItemData).Rect.Min.y == (pIVar3->ComboPreviewData).PreviewRect.Min.y;
  }
  if (bVar4) {
    bVar4 = ImRect::Contains(&pIVar2->ClipRect,&r->PreviewRect);
    if (!bVar4) {
      return false;
    }
    (pIVar3->ComboPreviewData).BackupCursorPos = (pIVar2->DC).CursorPos;
    (pIVar3->ComboPreviewData).BackupCursorMaxPos = (pIVar2->DC).CursorMaxPos;
    (pIVar3->ComboPreviewData).BackupCursorPosPrevLine = (pIVar2->DC).CursorPosPrevLine;
    (pIVar3->ComboPreviewData).BackupPrevLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
    (pIVar3->ComboPreviewData).BackupLayout = (pIVar2->DC).LayoutType;
    IVar5 = operator+((ImVec2 *)r,&(pIVar3->Style).FramePadding);
    (pIVar2->DC).CursorPos = IVar5;
    (pIVar2->DC).CursorMaxPos = (pIVar2->DC).CursorPos;
    (pIVar2->DC).LayoutType = 0;
    (pIVar2->DC).IsSameLine = false;
    PushClipRect((ImVec2 *)r,&(pIVar3->ComboPreviewData).PreviewRect.Max,true);
    return true;
  }
  __assert_fail("g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                ,0x6c2,"bool ImGui::BeginComboPreview()");
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !window->ClipRect.Overlaps(g.LastItemData.Rect)) // FIXME: Because we don't have a ImGuiItemStatusFlags_Visible flag to test last ItemAdd() result
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Contains(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}